

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FieldDescriptorProto::InternalSwap
          (FieldDescriptorProto *this,FieldDescriptorProto *other)

{
  uint32 uVar1;
  int32 iVar2;
  int iVar3;
  void *pvVar4;
  string *psVar5;
  FieldOptions *pFVar6;
  UnknownFieldSet *other_00;
  
  pvVar4 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar4 & 1) == 0) goto LAB_002ec463;
LAB_002ec456:
    other_00 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar4 & 1) != 0) goto LAB_002ec456;
    other_00 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
LAB_002ec463:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  psVar5 = (this->name_).ptr_;
  (this->name_).ptr_ = (other->name_).ptr_;
  (other->name_).ptr_ = psVar5;
  psVar5 = (this->extendee_).ptr_;
  (this->extendee_).ptr_ = (other->extendee_).ptr_;
  (other->extendee_).ptr_ = psVar5;
  psVar5 = (this->type_name_).ptr_;
  (this->type_name_).ptr_ = (other->type_name_).ptr_;
  (other->type_name_).ptr_ = psVar5;
  psVar5 = (this->default_value_).ptr_;
  (this->default_value_).ptr_ = (other->default_value_).ptr_;
  (other->default_value_).ptr_ = psVar5;
  psVar5 = (this->json_name_).ptr_;
  (this->json_name_).ptr_ = (other->json_name_).ptr_;
  (other->json_name_).ptr_ = psVar5;
  pFVar6 = this->options_;
  this->options_ = other->options_;
  other->options_ = pFVar6;
  iVar2 = this->number_;
  this->number_ = other->number_;
  other->number_ = iVar2;
  iVar2 = this->oneof_index_;
  this->oneof_index_ = other->oneof_index_;
  other->oneof_index_ = iVar2;
  iVar3 = this->label_;
  this->label_ = other->label_;
  other->label_ = iVar3;
  iVar3 = this->type_;
  this->type_ = other->type_;
  other->type_ = iVar3;
  return;
}

Assistant:

void FieldDescriptorProto::InternalSwap(FieldDescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  extendee_.Swap(&other->extendee_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  type_name_.Swap(&other->type_name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  default_value_.Swap(&other->default_value_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  json_name_.Swap(&other->json_name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(options_, other->options_);
  swap(number_, other->number_);
  swap(oneof_index_, other->oneof_index_);
  swap(label_, other->label_);
  swap(type_, other->type_);
}